

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O3

void __thiscall LR::build(LR *this)

{
  map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  *this_00;
  pointer pPVar1;
  mapped_type mVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  undefined8 uVar4;
  pointer pPVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  pointer pIVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  pointer pIVar13;
  undefined1 *puVar14;
  ulong uVar15;
  map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
  *pmVar16;
  _Alloc_hider _Var17;
  _Self __tmp;
  long lVar18;
  int iVar19;
  ulong uVar20;
  string X;
  Item item;
  Item goto_item;
  Prod prod;
  vector<Prod,_std::allocator<Prod>_> g_prods;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  undefined1 local_178 [8];
  undefined1 local_170 [40];
  undefined1 local_148 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_110 [8];
  _Alloc_hider local_108;
  undefined1 local_100 [8];
  char local_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  vector<Prod,_std::allocator<Prod>_> local_78;
  map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  *local_60;
  ulong local_58;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"build...",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  items(this);
  pIVar9 = (this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data
           ._M_start;
  pIVar13 = (this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_170._32_8_ = this;
  if (pIVar13 != pIVar9) {
    this_00 = &this->GOTO;
    pmVar16 = (map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
               *)0x0;
    do {
      local_170._16_8_ = pmVar16;
      std::vector<Prod,_std::allocator<Prod>_>::vector
                ((vector<Prod,_std::allocator<Prod>_> *)local_148,&pIVar9[(long)pmVar16].prods);
      uVar15 = 0;
      do {
        pcVar3 = str_all_abi_cxx11_[uVar15]._M_dataplus._M_p;
        local_170._24_8_ = uVar15;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,pcVar3 + str_all_abi_cxx11_[uVar15]._M_string_length);
        Goto((Item *)&local_128,this,(Item *)local_148,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pcVar3 = str_all_abi_cxx11_[uVar15]._M_dataplus._M_p;
        local_188 = (undefined1  [8])local_178;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_188,pcVar3,pcVar3 + str_all_abi_cxx11_[uVar15]._M_string_length);
        pIVar9 = (this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
            super__Vector_impl_data._M_finish != pIVar9) {
          lVar18 = 0;
          uVar20 = 0;
          do {
            bVar6 = Item::operator==((Item *)&local_128,
                                     (Item *)((long)&(pIVar9->prods).
                                                     super__Vector_base<Prod,_std::allocator<Prod>_>
                                                     ._M_impl.super__Vector_impl_data._M_start +
                                             lVar18));
            if (bVar6) {
              local_110._0_4_ = (int)local_170._16_8_;
              pcVar3 = str_all_abi_cxx11_[uVar15]._M_dataplus._M_p;
              local_108._M_p = local_100 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_108,pcVar3,
                         pcVar3 + str_all_abi_cxx11_[uVar15]._M_string_length);
              pmVar10 = std::
                        map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                        ::operator[](this_00,(key_type *)local_110);
              *pmVar10 = (mapped_type)uVar20;
              if (local_108._M_p != local_100 + 8) {
                operator_delete(local_108._M_p);
              }
              break;
            }
            uVar20 = uVar20 + 1;
            pIVar9 = (((vector<Item,_std::allocator<Item>_> *)(local_170._32_8_ + 0x18))->
                     super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = ((long)(((vector<Item,_std::allocator<Item>_> *)(local_170._32_8_ + 0x18))->
                           super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pIVar9 >> 3) *
                    -0x5555555555555555;
            lVar18 = lVar18 + 0x18;
          } while (uVar20 <= uVar8 && uVar8 - uVar20 != 0);
        }
        if (local_188 != (undefined1  [8])local_178) {
          operator_delete((void *)local_188);
        }
        std::vector<Prod,_std::allocator<Prod>_>::~vector
                  ((vector<Prod,_std::allocator<Prod>_> *)&local_128);
        this = (LR *)local_170._32_8_;
        uVar15 = local_170._24_8_ + 1;
      } while (uVar15 != 0x2c);
      std::vector<Prod,_std::allocator<Prod>_>::~vector
                ((vector<Prod,_std::allocator<Prod>_> *)local_148);
      pmVar16 = (map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                 *)(local_170._16_8_ + 1);
      pIVar9 = (((vector<Item,_std::allocator<Item>_> *)((long)this + 0x18))->
               super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      pIVar13 = (((vector<Item,_std::allocator<Item>_> *)((long)this + 0x18))->
                super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.super__Vector_impl_data.
                _M_finish;
      puVar14 = (undefined1 *)(((long)pIVar13 - (long)pIVar9 >> 3) * -0x5555555555555555);
    } while (pmVar16 <= puVar14 && (long)puVar14 - (long)pmVar16 != 0);
  }
  if (pIVar13 != pIVar9) {
    pPVar1 = (pointer)(local_148 + 0x10);
    local_170._16_8_ = &this->ACTION;
    local_60 = &this->GOTO;
    uVar15 = 0;
    do {
      local_170._24_8_ = uVar15;
      std::vector<Prod,_std::allocator<Prod>_>::vector
                ((vector<Prod,_std::allocator<Prod>_> *)&local_128,&pIVar9[uVar15].prods);
      if (local_128._8_8_ != local_128._M_allocated_capacity) {
        uVar15 = 0;
        do {
          uVar4 = local_128._M_allocated_capacity;
          local_110 = (undefined1  [8])local_100;
          lVar18 = *(long *)(local_128._M_allocated_capacity + uVar15 * 0x98);
          local_58 = uVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_110,lVar18,
                     *(long *)(local_128._M_allocated_capacity + uVar15 * 0x98 + 8) + lVar18);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_100 + 0x10),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(uVar4 + uVar15 * 0x98 + 0x20));
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree(&local_d8,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(uVar4 + uVar15 * 0x98 + 0x38));
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree(&local_a8,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(uVar4 + uVar15 * 0x98 + 0x68));
          if (local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar20 = 0;
            uVar15 = local_170._24_8_;
            do {
              lVar18 = uVar20 * 0x20;
              iVar7 = std::__cxx11::string::compare
                                ((char *)((long)local_f0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar18))
              ;
              iVar19 = (int)uVar15;
              if ((iVar7 == 0) &&
                 (uVar20 < ((long)local_f0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_f0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
                pcVar3 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)local_f0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x20))[uVar20].
                         _M_dataplus._M_p;
                local_148._0_8_ = pPVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_148,pcVar3,
                           pcVar3 + ((size_type *)
                                    ((long)local_f0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 0x28))
                                    [uVar20 * 4]);
                bVar6 = isVt((string *)local_148);
                if (bVar6) {
                  local_188._0_4_ = iVar19;
                  local_180._M_p = local_170;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_180,local_148._0_8_,
                             (pointer)(local_148._0_8_ + (long)(string *)local_148._8_8_));
                  pmVar10 = std::
                            map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                            ::operator[](local_60,(key_type *)local_188);
                  mVar2 = *pmVar10;
                  if (local_180._M_p != local_170) {
                    operator_delete(local_180._M_p);
                  }
                  local_180._M_p = local_170;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_180,local_148._0_8_,
                             (pointer)(local_148._0_8_ + (long)(string *)local_148._8_8_));
                  pmVar11 = std::
                            map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                            ::operator[]((map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                                          *)local_170._16_8_,(key_type *)local_188);
                  pmVar11->first = SHIFT;
                  pmVar11->second = mVar2;
                  if ((pointer)local_180._M_p != (pointer)local_170) {
                    operator_delete(local_180._M_p);
                  }
                }
                _Var17._M_p = (pointer)local_148._0_8_;
                if ((pointer)local_148._0_8_ != pPVar1) {
LAB_00106c87:
                  operator_delete(_Var17._M_p);
                }
              }
              else {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)((long)local_f0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar18
                                           ));
                if ((iVar7 == 0) &&
                   ((((long)local_f0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_f0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U == uVar20 &&
                    (iVar7 = std::__cxx11::string::compare(local_110), iVar7 != 0)))) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(local_100 + 0x10),
                             (iterator)
                             local_f0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  std::vector<Prod,_std::allocator<Prod>_>::vector
                            (&local_78,(vector<Prod,_std::allocator<Prod>_> *)local_170._32_8_);
                  p_Var12 = local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
                  if ((_Rb_tree_header *)local_d8._M_impl.super__Rb_tree_header._M_header._M_left !=
                      &local_d8._M_impl.super__Rb_tree_header) {
                    do {
                      local_148._0_8_ = pPVar1;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_148,*(long *)(p_Var12 + 1),
                                 (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
                      if (local_78.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                          super__Vector_impl_data._M_finish !=
                          local_78.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                          super__Vector_impl_data._M_start) {
                        lVar18 = 0x28;
                        uVar15 = 0;
                        do {
                          pPVar5 = local_78.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                          if (((local_108._M_p ==
                                *(pointer *)
                                 ((long)local_78.super__Vector_base<Prod,_std::allocator<Prod>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar18 + -0x20))
                              && (((local_108._M_p == (pointer)0x0 ||
                                   (iVar7 = bcmp((void *)local_110,
                                                 *(void **)((long)local_78.
                                                  super__Vector_base<Prod,_std::allocator<Prod>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                                  lVar18 + -0x28),(size_t)local_108._M_p),
                                   iVar7 == 0)) &&
                                  (__first2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                **)((long)pPVar5 + lVar18 + -8),
                                  (long)local_f0.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_f0.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start ==
                                  *(long *)((long)&(pPVar5->noTerminal)._M_dataplus._M_p + lVar18) -
                                  (long)__first2)))) &&
                             (bVar6 = std::__equal<false>::
                                      equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                                (local_f0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start,
                                                 local_f0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish,__first2
                                                ), bVar6)) {
                            local_188._0_4_ = (int)local_170._24_8_;
                            local_180._M_p = local_170;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_180,local_148._0_8_,
                                       (pointer)(local_148._0_8_ + (long)(string *)local_148._8_8_))
                            ;
                            pmVar11 = std::
                                      map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                                      ::operator[]((
                                                  map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                                                  *)local_170._16_8_,(key_type *)local_188);
                            pmVar11->first = REDUCE;
                            pmVar11->second = (int)uVar15;
                            if ((pointer)local_180._M_p != (pointer)local_170) {
                              operator_delete(local_180._M_p);
                            }
                          }
                          uVar15 = uVar15 + 1;
                          uVar8 = ((long)local_78.super__Vector_base<Prod,_std::allocator<Prod>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_78.super__Vector_base<Prod,_std::allocator<Prod>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 3) *
                                  -0x79435e50d79435e5;
                          lVar18 = lVar18 + 0x98;
                        } while (uVar15 <= uVar8 && uVar8 - uVar15 != 0);
                      }
                      if ((pointer)local_148._0_8_ != pPVar1) {
                        operator_delete((void *)local_148._0_8_);
                      }
                      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
                    } while ((_Rb_tree_header *)p_Var12 != &local_d8._M_impl.super__Rb_tree_header);
                  }
                  std::vector<Prod,_std::allocator<Prod>_>::~vector(&local_78);
                  uVar15 = local_170._24_8_;
                }
                else {
                  iVar7 = std::__cxx11::string::compare
                                    ((char *)((long)local_f0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar18
                                             ));
                  if (((iVar7 == 0) &&
                      (((long)local_f0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_f0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U == uVar20)) &&
                     (iVar7 = std::__cxx11::string::compare(local_110), iVar7 == 0)) {
                    local_188._0_4_ = iVar19;
                    std::__cxx11::string::string((string *)&local_180,"#",(allocator *)local_148);
                    pmVar11 = std::
                              map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                              ::operator[]((map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
                                            *)local_170._16_8_,(key_type *)local_188);
                    pmVar11->first = ACCEPT;
                    pmVar11->second = -1;
                    _Var17._M_p = local_180._M_p;
                    if ((pointer)local_180._M_p != (pointer)local_170) goto LAB_00106c87;
                  }
                }
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 < (ulong)((long)local_f0.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_f0.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_a8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_d8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_100 + 0x10));
          if (local_110 != (undefined1  [8])local_100) {
            operator_delete((void *)local_110);
          }
          uVar15 = local_58 + 1;
          uVar20 = ((long)(local_128._8_8_ - local_128._0_8_) >> 3) * -0x79435e50d79435e5;
          this = (LR *)local_170._32_8_;
        } while (uVar15 <= uVar20 && uVar20 - uVar15 != 0);
      }
      std::vector<Prod,_std::allocator<Prod>_>::~vector
                ((vector<Prod,_std::allocator<Prod>_> *)&local_128);
      uVar15 = local_170._24_8_ + 1;
      pIVar9 = (this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar20 = ((long)(this->C).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pIVar9 >> 3) * -0x5555555555555555;
    } while (uVar15 <= uVar20 && uVar20 - uVar15 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"build...end",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

void LR::build() { // 构造Action、GOTO表
    cout << "build..." << endl;
    items();
//    cout << "items end" << endl;

    for (int i = 0; i < C.size(); ++i) { // 逐个项目集
        Item item = C[i];
        //GOTO
        int length = sizeof(str_all) / sizeof(str_all[0]);
        for (int j = 0; j < length; j++) {
            Item goto_item = Goto(item, str_all[j]);
            string X = str_all[j];
            for (int m = 0; m < C.size(); m++) {
                if (goto_item == C[m]) {
                    GOTO[make_pair(i, str_all[j])] = m;
                    break;
                }
            }
        }
    }
    for (int i = 0; i < C.size(); ++i) { // 逐个项目集
        Item item = C[i];
        //Action
        for (int k = 0; k < item.prods.size(); k++) { // 逐个项目
            Prod prod = item.prods[k];
            for (int j = 0; j < prod.right.size(); j++) {
                if (prod.right[j] == "." && j < prod.right.size() - 1) {//A->α.aβ,b
                    string a = prod.right[j + 1];
                    if (isVt(a)) { // 终结符
                        int goto_index = GOTO[make_pair(i, a)];
                        ACTION[make_pair(i, a)] = make_pair(SHIFT, goto_index);
                    }
                } else if (prod.right[j] == "." && j == prod.right.size() - 1
                           && prod.noTerminal != "S'") {//A->α.,a
                    prod.right.erase(prod.right.end());//去掉最后的 . ,否则在后边的G文法项目比较的时候找不到相等的
                    vector<Prod> g_prods = G.prods;
                    for (set<string>::iterator it = prod.additionalVt.begin();
                         it != prod.additionalVt.end(); it++) {
                        string a = *it;
                        int m = 0;
                        for (m = 0; m < g_prods.size(); m++) {
                            if (prod.noTerminal == g_prods[m].noTerminal
                                && prod.right == g_prods[m].right) {
                                ACTION[make_pair(i, a)] = make_pair(REDUCE, m);
                            }
                        }
                    }
                } else if (prod.right[j] == "." && j == prod.right.size() - 1
                           && prod.noTerminal == "S'") {//A->α.,a
                    ACTION[make_pair(i, "#")] = make_pair(ACCEPT, -1);
                }
            }
        }

    }
    cout << "build...end" << endl;
}